

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsNumberToDouble(JsValueRef value,double *asDouble)

{
  code *pcVar1;
  bool bVar2;
  Data DVar3;
  undefined8 in_RAX;
  undefined4 *puVar4;
  JsErrorCode JVar5;
  double dVar6;
  DebugCheckNoException local_38;
  DebugCheckNoException __debugCheckNoException;
  
  if (value == (JsValueRef)0x0) {
    return JsErrorInvalidArgument;
  }
  if (asDouble == (double *)0x0) {
    return JsErrorNullArgument;
  }
  local_38._5_3_ = SUB83((ulong)in_RAX >> 0x28,0);
  local_38.__exceptionCheck.handledExceptionType = (ExceptionType)in_RAX;
  local_38.hasException = true;
  DVar3 = ExceptionCheck::Save();
  local_38.__exceptionCheck.handledExceptionType = DVar3.handledExceptionType;
  if (((ulong)value & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)value & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/TaggedInt.inl"
                       ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                       "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (((ulong)value & 0xffff000000000000) == 0x1000000000000) {
    dVar6 = (double)(int)value;
  }
  else {
    if ((ulong)value >> 0x32 == 0) {
      JVar5 = JsErrorInvalidArgument;
      dVar6 = 0.0;
      goto LAB_0036f1e8;
    }
    dVar6 = (double)((ulong)value ^ 0xfffc000000000000);
  }
  JVar5 = JsNoError;
LAB_0036f1e8:
  *asDouble = dVar6;
  local_38.hasException = false;
  DebugCheckNoException::~DebugCheckNoException(&local_38);
  return JVar5;
}

Assistant:

CHAKRA_API JsNumberToDouble(_In_ JsValueRef value, _Out_ double *asDouble)
{
    VALIDATE_JSREF(value);
    PARAM_NOT_NULL(asDouble);

    BEGIN_JSRT_NO_EXCEPTION
    {
        if (Js::TaggedInt::Is(value))
        {
            *asDouble = Js::TaggedInt::ToDouble(value);
        }